

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCommon.h
# Opt level: O0

void __thiscall
ASTFinder<luna::Terminator,_FindName>::~ASTFinder(ASTFinder<luna::Terminator,_FindName> *this)

{
  Visitor *in_RDI;
  
  in_RDI->_vptr_Visitor = (_func_int **)&PTR__ASTFinder_00269c10;
  FindName::~FindName((FindName *)0x1b50da);
  luna::Visitor::~Visitor(in_RDI);
  return;
}

Assistant:

explicit ASTFinder(const FinderType &finder)
        : the_ast_node_(nullptr), finder_(finder) { }